

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int wally_tx_get_weight(wally_tx *tx,size_t *written)

{
  int iVar1;
  size_t local_40;
  size_t is_elements;
  size_t witness_count;
  size_t witness_size;
  size_t base_size;
  size_t *written_local;
  wally_tx *tx_local;
  
  local_40 = 0;
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  base_size = (size_t)written;
  written_local = (size_t *)tx;
  iVar1 = wally_tx_is_elements(tx,&local_40);
  if (((iVar1 == 0) && (base_size != 0)) &&
     (iVar1 = tx_get_lengths((wally_tx *)written_local,(tx_serialize_opts *)0x0,1,&witness_size,
                             &witness_count,&is_elements,local_40 != 0), iVar1 == 0)) {
    if (is_elements == 0) {
      *(size_t *)base_size = witness_size << 2;
    }
    else {
      *(size_t *)base_size = witness_size * 4 + witness_count;
    }
    return 0;
  }
  return -2;
}

Assistant:

int wally_tx_get_weight(const struct wally_tx *tx, size_t *written)
{
    size_t base_size, witness_size, witness_count;
    size_t is_elements = 0;

    if (written)
        *written = 0;

#ifdef BUILD_ELEMENTS
    if (wally_tx_is_elements(tx, &is_elements) != WALLY_OK)
        return WALLY_EINVAL;
#endif

    if (!written ||
        tx_get_lengths(tx, NULL, WALLY_TX_FLAG_USE_WITNESS, &base_size,
                       &witness_size, &witness_count, is_elements != 0) != WALLY_OK)
        return WALLY_EINVAL;

    if (witness_count)
        *written = base_size * 4 + witness_size;
    else
        *written = base_size * 4;

    return WALLY_OK;
}